

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O3

uint aom_get_mb_ss_sse2(int16_t *src)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  
  iVar2 = 0;
  iVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  lVar1 = 0;
  do {
    auVar6 = pmaddwd(*(undefined1 (*) [16])((long)src + lVar1),
                     *(undefined1 (*) [16])((long)src + lVar1));
    iVar2 = iVar2 + auVar6._0_4_;
    iVar3 = iVar3 + auVar6._4_4_;
    iVar4 = iVar4 + auVar6._8_4_;
    iVar5 = iVar5 + auVar6._12_4_;
    lVar1 = lVar1 + 0x10;
  } while ((int)lVar1 != 0x200);
  return iVar5 + iVar3 + iVar4 + iVar2;
}

Assistant:

unsigned int aom_get_mb_ss_sse2(const int16_t *src) {
  __m128i vsum = _mm_setzero_si128();
  int i;

  for (i = 0; i < 32; ++i) {
    const __m128i v = xx_loadu_128(src);
    vsum = _mm_add_epi32(vsum, _mm_madd_epi16(v, v));
    src += 8;
  }

  vsum = _mm_add_epi32(vsum, _mm_srli_si128(vsum, 8));
  vsum = _mm_add_epi32(vsum, _mm_srli_si128(vsum, 4));
  return (unsigned int)_mm_cvtsi128_si32(vsum);
}